

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O2

void __thiscall SAT::printLearntStats(SAT *this)

{
  Clause **ppCVar1;
  Clause *pCVar2;
  ostream *poVar3;
  ulong uVar4;
  string local_50;
  
  ppCVar1 = (this->learnts).data;
  std::__sort<Clause**,__gnu_cxx::__ops::_Iter_comp_iter<raw_activity_gt>>
            (ppCVar1,ppCVar1 + (this->learnts).sz);
  std::operator<<((ostream *)&std::cerr,"top ten clauses:\n");
  for (uVar4 = 0; (uVar4 < 10 && (uVar4 < (this->learnts).sz)); uVar4 = uVar4 + 1) {
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    poVar3 = std::operator<<(poVar3,": ");
    pCVar2 = (this->learnts).data[uVar4];
    poVar3 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)poVar3,pCVar2[1].data[(ulong)(*(uint *)pCVar2 >> 8) - 1].x);
    poVar3 = std::operator<<(poVar3," ");
    showClause_abi_cxx11_(&local_50,(this->learnts).data[uVar4]);
    poVar3 = std::operator<<(poVar3,(string *)&local_50);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void SAT::printLearntStats() {
	/* std::ofstream clausefile("clause-info.csv"); */
	/* for (int i = 0 ; i < learnts.size() ; i++) { */
	/*   clausefile << learnts[i]->clauseID() << "," << learnts[i]->rawActivity() << "," <<
	 * showClause(*learnts[i]) << "\n"; */
	/* } */

	std::sort((Clause**)learnts, (Clause**)learnts + learnts.size(), raw_activity_gt());
	std::cerr << "top ten clauses:\n";
	for (unsigned int i = 0; i < 10 && i < learnts.size(); i++) {
		std::cerr << i << ": " << learnts[i]->rawActivity() << " " << showClause(*learnts[i]) << "\n";
	}
}